

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

void __thiscall duckdb::ColumnStatsUnifier::~ColumnStatsUnifier(ColumnStatsUnifier *this)

{
  pointer pcVar1;
  
  this->_vptr_ColumnStatsUnifier = (_func_int **)&PTR__ColumnStatsUnifier_024b7240;
  pcVar1 = (this->global_max)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->global_max).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->global_min)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->global_min).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->column_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->column_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~ColumnStatsUnifier() = default;